

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O1

void err_cb(exr_const_context_t f,exr_result_t code,char *msg)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"err_cb ",7);
  __s = (char *)exr_get_error_code_as_string(code);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19b870);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,code);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"): ",3);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,msg,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

static void
err_cb (exr_const_context_t f, exr_result_t code, const char* msg)
{
    std::cerr << "err_cb " << exr_get_error_code_as_string (code) << " ("
              << code << "): " << msg << std::endl;
}